

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void __thiscall BufferTest_Resize_Test::TestBody(BufferTest_Resize_Test *this)

{
  bool bVar1;
  MockSpec<void_(unsigned_long)> *pMVar2;
  _func_int **pp_Var3;
  AssertionResult gtest_ar;
  char data [123];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  AssertHelper local_150;
  Matcher<unsigned_long> local_148;
  undefined **local_130;
  undefined1 *local_128;
  undefined8 uStack_120;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  FunctionMockerBase<void_(unsigned_long)> local_110;
  undefined1 local_a8 [10];
  char local_9e [126];
  
  local_118 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128 = (undefined1 *)0x0;
  uStack_120 = 0;
  local_130 = &PTR_grow_001d5ca8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_110.super_UntypedFunctionMockerBase);
  local_110.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)0x0;
  local_110.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>.impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_110.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>.impl_ + 8);
  local_110.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d5b88;
  local_110.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001d6580;
  local_128 = local_a8;
  local_118 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &DAT_0000007b;
  local_9e[0] = '*';
  local_158.ptr_._0_4_ = 0x2a;
  local_110.current_spec_.function_mocker_ = &local_110;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&local_148,"42","buffer[10]",(int *)&local_158,local_9e);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x9e,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_118 <
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014) {
    (*(code *)*local_130)(&local_130,0x14);
  }
  uStack_120 = 0x14;
  local_150.data_._0_4_ = 0x14;
  local_158.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_148,"20u","buffer.size()",(uint *)&local_150,
             (unsigned_long *)&local_158);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa0,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_150.data_._0_4_ = 0x7b;
  local_158.ptr_ = local_118;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_148,"123u","buffer.capacity()",(uint *)&local_150,
             (unsigned_long *)&local_158);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa1,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_158.ptr_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&local_148,"42","buffer[10]",(int *)&local_158,local_128 + 10);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa2,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_118 <
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005) {
    (*(code *)*local_130)(&local_130,5);
  }
  uStack_120 = 5;
  local_150.data_._0_4_ = 5;
  local_158.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_148,"5u","buffer.size()",(uint *)&local_150,
             (unsigned_long *)&local_158);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa4,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_150.data_._0_4_ = 0x7b;
  local_158.ptr_ = local_118;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_148,"123u","buffer.capacity()",(uint *)&local_150,
             (unsigned_long *)&local_158);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa5,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_158.ptr_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&local_148,"42","buffer[10]",(int *)&local_158,local_128 + 10);
  if (local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_148.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = ((local_148.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xa6,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_158.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_158.ptr_ + 8))();
      }
      local_158.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_148.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::Matcher<unsigned_long>::Matcher(&local_148,0x7c);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&local_110.super_UntypedFunctionMockerBase,&local_130);
  pMVar2 = testing::internal::FunctionMocker<void_(unsigned_long)>::With
                     ((FunctionMocker<void_(unsigned_long)> *)&local_110,&local_148);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0xa8,"buffer","do_grow(124)");
  local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d5bd0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_148.super_MatcherBase<unsigned_long>.impl_);
  if (local_118 < (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7c) {
    (*(code *)*local_130)(&local_130,0x7c);
  }
  uStack_120 = 0x7c;
  testing::Matcher<unsigned_long>::Matcher(&local_148,200);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&local_110.super_UntypedFunctionMockerBase,&local_130);
  pMVar2 = testing::internal::FunctionMocker<void_(unsigned_long)>::With
                     ((FunctionMocker<void_(unsigned_long)> *)&local_110,&local_148);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0xaa,"buffer","do_grow(200)");
  local_148.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d5bd0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_148.super_MatcherBase<unsigned_long>.impl_);
  if (local_118 < (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc8) {
    (*(code *)*local_130)(&local_130,200);
  }
  uStack_120 = 200;
  local_130 = &PTR_grow_001d5ca8;
  testing::internal::FunctionMockerBase<void_(unsigned_long)>::~FunctionMockerBase(&local_110);
  return;
}

Assistant:

TEST(BufferTest, Resize) {
  char data[123];
  mock_buffer<char> buffer(data, sizeof(data));
  buffer[10] = 42;
  EXPECT_EQ(42, buffer[10]);
  buffer.resize(20);
  EXPECT_EQ(20u, buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
  EXPECT_EQ(42, buffer[10]);
  buffer.resize(5);
  EXPECT_EQ(5u, buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
  EXPECT_EQ(42, buffer[10]);
  // Check if resize calls grow.
  EXPECT_CALL(buffer, do_grow(124));
  buffer.resize(124);
  EXPECT_CALL(buffer, do_grow(200));
  buffer.resize(200);
}